

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O1

UBool uset_resemblesPattern_63(UChar *pattern,int32_t patternLength,int32_t pos)

{
  UBool UVar1;
  bool bVar2;
  UnicodeString pat;
  UnicodeString UStack_58;
  
  icu_63::UnicodeString::UnicodeString(&UStack_58,pattern,patternLength);
  if (-1 < UStack_58.fUnion.fStackFields.fLengthAndFlags) {
    UStack_58.fUnion.fFields.fLength = (int)UStack_58.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if ((uint)pos < (uint)UStack_58.fUnion.fFields.fLength &&
      pos + 1 < UStack_58.fUnion.fFields.fLength) {
    if (((int)UStack_58.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      UStack_58.fUnion.fFields.fArray = UStack_58.fUnion.fStackFields.fBuffer;
    }
    bVar2 = true;
    if (*(char16_t *)((long)UStack_58.fUnion.fFields.fArray + (long)pos * 2) == L'[')
    goto LAB_00377452;
  }
  UVar1 = icu_63::UnicodeSet::resemblesPattern(&UStack_58,pos);
  bVar2 = UVar1 != '\0';
LAB_00377452:
  icu_63::UnicodeString::~UnicodeString(&UStack_58);
  return bVar2;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_resemblesPattern(const UChar *pattern, int32_t patternLength,
                      int32_t pos) {

    UnicodeString pat(pattern, patternLength);

    return ((pos+1) < pat.length() &&
            pat.charAt(pos) == (UChar)91/*[*/) ||
            UnicodeSet::resemblesPattern(pat, pos);
}